

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

xmlXIncludeRefPtr xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  xmlParserInputBufferPtr in;
  xmlNodeSetPtr pxVar3;
  xmlDocPtr pxVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  xmlParserErrors error;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  xmlChar *pxVar11;
  xmlXIncludeRefPtr pxVar12;
  xmlXPathObjectPtr obj;
  xmlChar *pxVar13;
  xmlXPathContextPtr ctxt_00;
  size_t sVar14;
  xmlParserCtxtPtr pxVar15;
  xmlParserInputPtr pxVar16;
  xmlNodePtr pxVar17;
  xmlXIncludeDoc *pxVar18;
  xmlChar *pxVar19;
  _xmlDtd *p_Var20;
  _xmlDtd *p_Var21;
  xmlXIncludeRefPtr *ppxVar22;
  xmlXIncludeTxt *pxVar23;
  xmlNodePtr pxVar24;
  xmlDoc *pxVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  uint uVar29;
  xmlNodePtr pxVar30;
  _xmlDict *dict;
  _xmlNode **pp_Var31;
  undefined4 uVar32;
  xmlXIncludeRefPtr pxVar33;
  uint uVar34;
  long lVar35;
  xmlDocPtr cur;
  xmlNodePtr pxVar36;
  bool bVar37;
  xmlChar *local_88;
  xmlChar *base;
  xmlURIPtr uri;
  xmlXIncludeCtxtPtr local_50;
  xmlXIncludeDoc *local_48;
  undefined8 uStack_40;
  xmlChar *local_38;
  
  if (ctxt->fatalErr != 0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  if (0x27 < ctxt->depth) {
    xmlXIncludeErr(ctxt,node,0x640,"maximum recursion depth exceeded\n",(xmlChar *)0x0);
    ctxt->fatalErr = 1;
    return (xmlXIncludeRefPtr)0x0;
  }
  uVar26 = 0;
  uVar10 = (ulong)(uint)ctxt->incNr;
  if (ctxt->incNr < 1) {
    uVar10 = uVar26;
  }
  while (uVar10 != uVar26) {
    pxVar12 = ctxt->incTab[uVar26];
    uVar26 = uVar26 + 1;
    if (pxVar12->elem == node) {
      if (pxVar12->expanding != 0) {
        xmlXIncludeErr(ctxt,node,0x640,"inclusion loop detected\n",(xmlChar *)0x0);
        return (xmlXIncludeRefPtr)0x0;
      }
      return pxVar12;
    }
  }
  uri = (xmlURIPtr)0x0;
  base = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  local_88 = xmlXIncludeGetProp(ctxt,node,(xmlChar *)"xpointer");
  pxVar11 = xmlXIncludeGetProp(ctxt,node,"href");
  if (pxVar11 == (xmlChar *)0x0) {
    if (local_88 == (xmlChar *)0x0) {
      pxVar13 = (xmlChar *)0x0;
      xmlXIncludeErr(ctxt,node,0x643,"href or xpointer must be present\n",(xmlChar *)0x0);
      pxVar19 = (xmlChar *)0x0;
      local_88 = (xmlChar *)0x0;
    }
    else {
      pxVar11 = xmlStrdup("");
      if (pxVar11 != (xmlChar *)0x0) goto LAB_001abf28;
      xmlXIncludeErrMemory(ctxt);
      pxVar13 = (xmlChar *)0x0;
      pxVar19 = (xmlChar *)0x0;
    }
LAB_001ac1b9:
    pxVar12 = (xmlXIncludeRefPtr)0x0;
LAB_001ac1bc:
    pxVar33 = pxVar12;
    pxVar12 = (xmlXIncludeRefPtr)0x0;
  }
  else {
    iVar7 = xmlStrlen(pxVar11);
    if (2000 < iVar7) {
      pcVar27 = "URI too long\n";
      pxVar19 = (xmlChar *)0x0;
      iVar7 = 0x645;
      pxVar13 = (xmlChar *)0x0;
LAB_001ac046:
      xmlXIncludeErr(ctxt,node,iVar7,pcVar27,pxVar13);
      pxVar13 = pxVar11;
      goto LAB_001ac1b9;
    }
LAB_001abf28:
    pxVar19 = xmlXIncludeGetProp(ctxt,node,(xmlChar *)"parse");
    uVar32 = 1;
    bVar5 = 1;
    if ((pxVar19 != (xmlChar *)0x0) &&
       (iVar7 = xmlStrEqual(pxVar19,(xmlChar *)"xml"), bVar5 = 1, iVar7 == 0)) {
      iVar7 = xmlStrEqual(pxVar19,"text");
      bVar5 = 0;
      uVar32 = 0;
      if (iVar7 == 0) {
        pcVar27 = "invalid value %s for \'parse\'\n";
        iVar7 = 0x641;
        pxVar13 = pxVar19;
        goto LAB_001ac046;
      }
    }
    local_48 = (xmlXIncludeDoc *)CONCAT44(local_48._4_4_,uVar32);
    iVar7 = xmlParseURISafe((char *)pxVar11,&uri);
    if (uri == (xmlURIPtr)0x0) {
      if (-1 < iVar7) {
        pcVar27 = "invalid value href %s\n";
        iVar7 = 0x645;
        pxVar13 = pxVar11;
        goto LAB_001ac046;
      }
LAB_001ac1b1:
      xmlXIncludeErrMemory(ctxt);
      pxVar13 = pxVar11;
      goto LAB_001ac1b9;
    }
    pxVar13 = (xmlChar *)uri->fragment;
    if (pxVar13 != (xmlChar *)0x0) {
      if (ctxt->legacy == 0) {
        pcVar27 = "Invalid fragment identifier in URI %s use the xpointer attribute\n";
        iVar7 = 0x652;
        pxVar13 = pxVar11;
        goto LAB_001ac046;
      }
      if (local_88 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar13);
        pxVar13 = local_88;
      }
      local_88 = pxVar13;
      uri->fragment = (char *)0x0;
    }
    pxVar13 = xmlSaveUri(uri);
    local_38 = pxVar13;
    if (pxVar13 == (xmlChar *)0x0) goto LAB_001ac1b1;
    (*xmlFree)(pxVar11);
    iVar7 = xmlNodeGetBaseSafe(ctxt->doc,node,&base);
    if (iVar7 < 0) {
LAB_001ac0f3:
      xmlXIncludeErrMemory(ctxt);
LAB_001ac0fe:
      pxVar12 = (xmlXIncludeRefPtr)0x0;
      goto LAB_001ac1bc;
    }
    if (*pxVar13 != '\0') {
      iVar7 = xmlBuildURISafe(pxVar13,base,&local_38);
      if (iVar7 < 0) goto LAB_001ac0f3;
      if (local_38 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar13);
        pxVar13 = local_38;
        iVar7 = xmlStrEqual(local_38,ctxt->doc->URL);
        bVar37 = iVar7 != 0;
        goto LAB_001ac10b;
      }
      xmlXIncludeErr(ctxt,node,0x645,"failed build URL\n",(xmlChar *)0x0);
      goto LAB_001ac0fe;
    }
    bVar37 = true;
LAB_001ac10b:
    iVar7 = (int)local_48;
    pxVar11 = pxVar13;
    if (((bool)(bVar5 & bVar37)) && ((local_88 == (xmlChar *)0x0 || (*local_88 == '\0')))) {
      pcVar27 = "detected a local recursion with no xpointer in %s\n";
      iVar7 = 0x640;
      goto LAB_001ac046;
    }
    pxVar12 = (xmlXIncludeRefPtr)(*xmlMalloc)(0x38);
    if (pxVar12 == (xmlXIncludeRefPtr)0x0) goto LAB_001ac1b1;
    pxVar12->expanding = 0;
    pxVar12->replace = 0;
    pxVar12->base = (xmlChar *)0x0;
    pxVar12->elem = (xmlNodePtr)0x0;
    pxVar12->inc = (xmlNodePtr)0x0;
    pxVar12->xml = 0;
    pxVar12->fallback = 0;
    pxVar12->elem = node;
    pxVar12->xml = iVar7;
    pxVar12->URI = pxVar13;
    pxVar12->fragment = local_88;
    if ((((ctxt->parseFlags & 0x40000) != 0) || (node->doc == (_xmlDoc *)0x0)) ||
       ((node->doc->parseFlags & 0x40000) != 0)) {
LAB_001acd7e:
      iVar7 = ctxt->incNr;
      uVar8 = ctxt->incMax;
      if (iVar7 < (int)uVar8) {
        ppxVar22 = ctxt->incTab;
      }
      else {
        if ((int)uVar8 < 1) {
          uVar29 = 4;
        }
        else {
          if (999999999 < uVar8) goto LAB_001acdfc;
          uVar34 = uVar8 + 1 >> 1;
          uVar29 = uVar34 + uVar8;
          if (1000000000 - uVar34 < uVar8) {
            uVar29 = 1000000000;
          }
        }
        ppxVar22 = (xmlXIncludeRefPtr *)(*xmlRealloc)(ctxt->incTab,(ulong)uVar29 << 3);
        if (ppxVar22 == (xmlXIncludeRefPtr *)0x0) goto LAB_001acdfc;
        ctxt->incTab = ppxVar22;
        ctxt->incMax = uVar29;
        iVar7 = ctxt->incNr;
      }
      ctxt->incNr = iVar7 + 1;
      ppxVar22[iVar7] = pxVar12;
      pxVar13 = (xmlChar *)0x0;
      local_88 = (xmlChar *)0x0;
      goto LAB_001ac1bc;
    }
    if (base != (xmlChar *)0x0) {
      pxVar12->base = base;
      base = (xmlChar *)0x0;
      goto LAB_001acd7e;
    }
    pxVar11 = xmlStrdup("");
    pxVar12->base = pxVar11;
    if (pxVar11 != (xmlChar *)0x0) goto LAB_001acd7e;
LAB_001acdfc:
    xmlXIncludeErrMemory(ctxt);
    pxVar13 = (xmlChar *)0x0;
    local_88 = (xmlChar *)0x0;
    pxVar33 = (xmlXIncludeRefPtr)0x0;
  }
  xmlXIncludeFreeRef(pxVar12);
  xmlFreeURI(uri);
  (*xmlFree)(pxVar13);
  (*xmlFree)(pxVar19);
  (*xmlFree)(local_88);
  (*xmlFree)(base);
  if (pxVar33 == (xmlXIncludeRefPtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  pxVar33->expanding = 1;
  ctxt->depth = ctxt->depth + 1;
  pxVar30 = pxVar33->elem;
  if (pxVar30 == (xmlNodePtr)0x0) goto LAB_001ac9b3;
  pxVar11 = pxVar33->URI;
  if (pxVar33->xml != 0) {
    pxVar13 = pxVar33->fragment;
    if (((*pxVar11 != '\0') && (*pxVar11 != '#')) &&
       ((ctxt->doc == (xmlDocPtr)0x0 || (iVar7 = xmlStrEqual(pxVar11,ctxt->doc->URL), iVar7 == 0))))
    {
      lVar28 = -1;
      lVar6 = 0;
LAB_001ac3bb:
      lVar35 = lVar6;
      lVar28 = lVar28 + 1;
      if (lVar28 < ctxt->urlNr) goto code_r0x001ac3cb;
      local_48 = (xmlXIncludeDoc *)CONCAT44(local_48._4_4_,8);
      uVar8 = ctxt->parseFlags;
      if (pxVar13 != (xmlChar *)0x0) {
        ctxt->parseFlags = uVar8 | 2;
      }
      xmlInitParser();
      pxVar15 = xmlNewParserCtxt();
      if (pxVar15 == (xmlParserCtxtPtr)0x0) {
        xmlXIncludeErrMemory(ctxt);
        cur = (xmlDocPtr)0x0;
      }
      else {
        if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
          xmlCtxtSetErrorHandler(pxVar15,ctxt->errorHandler,ctxt->errorCtxt);
        }
        if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
          xmlCtxtSetResourceLoader(pxVar15,ctxt->resourceLoader,ctxt->resourceCtxt);
        }
        pxVar15->_private = ctxt->_private;
        if ((ctxt->doc != (xmlDocPtr)0x0) && (dict = ctxt->doc->dict, dict != (_xmlDict *)0x0)) {
          if (pxVar15->dict != (xmlDictPtr)0x0) {
            xmlDictFree(pxVar15->dict);
            dict = ctxt->doc->dict;
          }
          pxVar15->dict = dict;
          xmlDictReference(dict);
        }
        xmlCtxtUseOptions(pxVar15,ctxt->parseFlags | 4);
        cur = (xmlDocPtr)0x0;
        pxVar16 = xmlLoadResource(pxVar15,(char *)pxVar11,(char *)0x0,XML_RESOURCE_XINCLUDE);
        if (pxVar16 != (xmlParserInputPtr)0x0) {
          iVar7 = xmlCtxtPushInput(pxVar15,pxVar16);
          if (iVar7 < 0) {
            xmlFreeInputStream(pxVar16);
          }
          else {
            xmlParseDocument(pxVar15);
            cur = pxVar15->myDoc;
            if (pxVar15->wellFormed != 0) goto LAB_001aca07;
            if (cur != (xmlDocPtr)0x0) {
              xmlFreeDoc(cur);
            }
            pxVar15->myDoc = (xmlDocPtr)0x0;
          }
          cur = (xmlDocPtr)0x0;
        }
LAB_001aca07:
        iVar7 = xmlCtxtIsCatastrophicError(pxVar15);
        if (iVar7 != 0) {
          xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,pxVar15->errNo,"parser error",(xmlChar *)0x0);
        }
        xmlFreeParserCtxt(pxVar15);
      }
      ctxt->parseFlags = uVar8;
      iVar7 = ctxt->urlNr;
      uVar8 = ctxt->urlMax;
      if (iVar7 < (int)uVar8) {
        pxVar18 = ctxt->urlTab;
LAB_001acaa7:
        pxVar18[iVar7].doc = cur;
        pxVar19 = xmlStrdup(pxVar11);
        pxVar18[iVar7].url = pxVar19;
        if (pxVar19 == (xmlChar *)0x0) {
          xmlXIncludeErrMemory(ctxt);
          xmlFreeDoc(cur);
        }
        else {
          local_48 = pxVar18 + iVar7;
          local_48->expanding = 0;
          iVar7 = ctxt->urlNr;
          ctxt->urlNr = iVar7 + 1;
          if (cur != (xmlDocPtr)0x0) {
            if (cur->URL != (xmlChar *)0x0) {
              xmlStrEqual(pxVar11,cur->URL);
            }
            p_Var20 = cur->intSubset;
            if (p_Var20 != (_xmlDtd *)0x0) {
              pxVar25 = ctxt->doc;
              p_Var21 = pxVar25->intSubset;
              if (p_Var21 == (_xmlDtd *)0x0) {
                pxVar17 = xmlDocGetRootElement(pxVar25);
                if (pxVar17 != (xmlNodePtr)0x0) {
                  p_Var21 = xmlCreateIntSubset(pxVar25,pxVar17->name,(xmlChar *)0x0,(xmlChar *)0x0);
                  if (p_Var21 != (xmlDtdPtr)0x0) {
                    p_Var20 = cur->intSubset;
                    if (p_Var20 != (_xmlDtd *)0x0) goto LAB_001acb26;
                    goto LAB_001acb47;
                  }
                  xmlXIncludeErrMemory(ctxt);
                }
              }
              else {
LAB_001acb26:
                if ((xmlHashTablePtr)p_Var20->entities != (xmlHashTablePtr)0x0) {
                  uri = (xmlURIPtr)pxVar25;
                  local_50 = ctxt;
                  xmlHashScan((xmlHashTablePtr)p_Var20->entities,xmlXIncludeMergeEntity,&uri);
                }
LAB_001acb47:
                p_Var20 = cur->extSubset;
                if ((((p_Var20 != (_xmlDtd *)0x0) && (p_Var20->entities != (void *)0x0)) &&
                    (uri = (xmlURIPtr)pxVar25, local_50 = ctxt,
                    iVar9 = xmlStrEqual(p_Var21->ExternalID,p_Var20->ExternalID), iVar9 == 0)) &&
                   (iVar9 = xmlStrEqual(p_Var21->SystemID,p_Var20->SystemID), iVar9 == 0)) {
                  xmlHashScan((xmlHashTablePtr)p_Var20->entities,xmlXIncludeMergeEntity,&uri);
                }
              }
            }
            local_48->expanding = 1;
            pxVar4 = ctxt->doc;
            ppxVar22 = ctxt->incTab;
            local_48 = *(xmlXIncludeDoc **)&ctxt->incNr;
            uStack_40 = 0;
            iVar9 = ctxt->isStream;
            ctxt->doc = cur;
            ctxt->isStream = 0;
            ctxt->incNr = 0;
            ctxt->incMax = 0;
            ctxt->incTab = (xmlXIncludeRefPtr *)0x0;
            pxVar17 = xmlDocGetRootElement(cur);
            xmlXIncludeDoProcess(ctxt,pxVar17);
            if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
              for (lVar28 = 0; lVar28 < ctxt->incNr; lVar28 = lVar28 + 1) {
                xmlXIncludeFreeRef(ctxt->incTab[lVar28]);
              }
              (*xmlFree)(ctxt->incTab);
            }
            ctxt->doc = pxVar4;
            *(xmlXIncludeDoc **)&ctxt->incNr = local_48;
            ctxt->incTab = ppxVar22;
            ctxt->isStream = iVar9;
            ctxt->urlTab[iVar7].expanding = 0;
            goto LAB_001ac263;
          }
        }
      }
      else {
        if ((int)uVar8 < 1) {
LAB_001aca78:
          pxVar18 = (xmlXIncludeDoc *)
                    (*xmlRealloc)(ctxt->urlTab,((ulong)local_48 & 0xffffffff) * 0x18);
          if (pxVar18 != (xmlXIncludeDoc *)0x0) {
            ctxt->urlMax = (int)local_48;
            ctxt->urlTab = pxVar18;
            iVar7 = ctxt->urlNr;
            goto LAB_001acaa7;
          }
        }
        else if (uVar8 < 1000000000) {
          uVar29 = uVar8 + 1 >> 1;
          iVar7 = uVar29 + uVar8;
          if (1000000000 - uVar29 < uVar8) {
            iVar7 = 1000000000;
          }
          local_48 = (xmlXIncludeDoc *)CONCAT44(local_48._4_4_,iVar7);
          goto LAB_001aca78;
        }
        xmlXIncludeErrMemory(ctxt);
        xmlFreeDoc(cur);
      }
      goto LAB_001ac8eb;
    }
    cur = ctxt->doc;
    goto LAB_001ac263;
  }
  uri = (xmlURIPtr)0x0;
  if (*pxVar11 != '\0') {
    lVar28 = -1;
    lVar6 = 0;
    do {
      lVar35 = lVar6;
      lVar28 = lVar28 + 1;
      if (ctxt->txtNr <= lVar28) {
        if ((pxVar33->elem == (xmlNodePtr)0x0) ||
           (pxVar13 = xmlXIncludeGetProp(ctxt,pxVar33->elem,"encoding"), pxVar13 == (xmlChar *)0x0))
        {
          pxVar13 = (xmlChar *)0x0;
LAB_001ac536:
          pxVar15 = xmlNewParserCtxt();
          if (pxVar15 != (xmlParserCtxtPtr)0x0) {
            if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
              xmlCtxtSetErrorHandler(pxVar15,ctxt->errorHandler,ctxt->errorCtxt);
            }
            if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
              xmlCtxtSetResourceLoader(pxVar15,ctxt->resourceLoader,ctxt->resourceCtxt);
            }
            pxVar16 = xmlLoadResource(pxVar15,(char *)pxVar11,(char *)0x0,XML_RESOURCE_XINCLUDE_TEXT
                                     );
            if (pxVar16 == (xmlParserInputPtr)0x0) {
              iVar7 = pxVar15->errNo;
              if ((iVar7 == 0) || (iVar7 == 0x5f4)) {
                pxVar17 = (xmlNodePtr)0x0;
                pxVar16 = (xmlParserInputPtr)0x0;
                goto LAB_001ac8c2;
              }
              if (iVar7 == 0x5dc) {
                pxVar17 = (xmlNodePtr)0x0;
                pxVar16 = (xmlParserInputPtr)0x0;
                goto LAB_001ac8c2;
              }
              if (iVar7 == 2) {
                xmlXIncludeErrMemory(ctxt);
              }
              else {
                xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,iVar7,"load error",(xmlChar *)0x0);
              }
              goto LAB_001ac8c0;
            }
            in = pxVar16->buf;
            if (in != (xmlParserInputBufferPtr)0x0) {
              if (in->encoder != (xmlCharEncodingHandler *)0x0) {
                xmlCharEncCloseFunc(in->encoder);
              }
              in->encoder = (xmlCharEncodingHandlerPtr)uri;
              uri = (xmlURIPtr)0x0;
              pxVar17 = xmlNewDocText(ctxt->doc,(xmlChar *)0x0);
              if (pxVar17 != (xmlNodePtr)0x0) goto LAB_001ac5df;
              xmlXIncludeErrMemory(ctxt);
            }
            pxVar17 = (xmlNodePtr)0x0;
            goto LAB_001ac8c2;
          }
          xmlXIncludeErrMemory(ctxt);
        }
        else {
          error = xmlOpenCharEncodingHandler((char *)pxVar13,0,(xmlCharEncodingHandler **)&uri);
          if (error == XML_ERR_OK) goto LAB_001ac536;
          if (error == XML_ERR_UNSUPPORTED_ENCODING) {
            xmlXIncludeErr(ctxt,pxVar33->elem,0x64a,"encoding %s not supported\n",pxVar13);
          }
          else {
            if (error == XML_ERR_NO_MEMORY) {
              xmlXIncludeErrMemory(ctxt);
              goto LAB_001ac536;
            }
            xmlXIncludeErr(ctxt,pxVar33->elem,error,"unexpected error from iconv or ICU\n",
                           (xmlChar *)0x0);
          }
        }
        pxVar15 = (xmlParserCtxtPtr)0x0;
        goto LAB_001ac8c0;
      }
      iVar7 = xmlStrEqual(pxVar11,*(xmlChar **)((long)&ctxt->txtTab->url + lVar35));
      lVar6 = lVar35 + 0x10;
    } while (iVar7 == 0);
    pxVar17 = xmlNewDocText(ctxt->doc,*(xmlChar **)((long)&ctxt->txtTab->text + lVar35));
    if (pxVar17 == (xmlNodePtr)0x0) {
      xmlXIncludeErrMemory(ctxt);
      pxVar16 = (xmlParserInputPtr)0x0;
      pxVar15 = (xmlParserCtxtPtr)0x0;
      pxVar13 = (xmlChar *)0x0;
      pxVar17 = (xmlNodePtr)0x0;
    }
    else {
      pxVar16 = (xmlParserInputPtr)0x0;
      pxVar15 = (xmlParserCtxtPtr)0x0;
      pxVar13 = (xmlChar *)0x0;
    }
    goto LAB_001ac7c1;
  }
  xmlXIncludeErr(ctxt,pxVar30,0x647,"text serialization of document not available\n",(xmlChar *)0x0)
  ;
  pxVar15 = (xmlParserCtxtPtr)0x0;
  pxVar13 = (xmlChar *)0x0;
LAB_001ac8c0:
  pxVar16 = (xmlParserInputPtr)0x0;
  pxVar17 = (xmlNodePtr)0x0;
LAB_001ac8c2:
  xmlFreeNode(pxVar17);
  xmlFreeInputStream(pxVar16);
  xmlFreeParserCtxt(pxVar15);
  xmlCharEncCloseFunc((xmlCharEncodingHandler *)uri);
  (*xmlFree)(pxVar13);
LAB_001ac8eb:
  pp_Var31 = &pxVar30->children;
  while (pxVar17 = *pp_Var31, pxVar17 != (xmlNodePtr)0x0) {
    if ((((pxVar17->type == XML_ELEMENT_NODE) && (pxVar17->ns != (xmlNs *)0x0)) &&
        (iVar7 = xmlStrEqual(pxVar17->name,(xmlChar *)"fallback"), iVar7 != 0)) &&
       ((iVar7 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar7 != 0 ||
        (iVar7 = xmlStrEqual(pxVar17->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar7 != 0)))) {
      if (pxVar17->type == XML_NAMESPACE_DECL) break;
      if (pxVar17->children == (_xmlNode *)0x0) {
        pxVar33->inc = (xmlNodePtr)0x0;
      }
      else {
        iVar7 = ctxt->nbErrors;
        pxVar17 = xmlXIncludeCopyNode(ctxt,pxVar17,1,pxVar33->base);
        pxVar33->inc = pxVar17;
        if (iVar7 < ctxt->nbErrors) {
          pxVar33->fallback = 1;
          break;
        }
      }
      pxVar33->fallback = 1;
      goto LAB_001ac9b3;
    }
    pp_Var31 = &pxVar17->next;
  }
  xmlXIncludeErr(ctxt,pxVar30,0x644,"could not load %s, and no fallback was found\n",pxVar33->URI);
LAB_001ac9b3:
  ctxt->depth = ctxt->depth + -1;
  pxVar33->expanding = 0;
  return pxVar33;
code_r0x001ac3cb:
  iVar7 = xmlStrEqual(pxVar11,*(xmlChar **)((long)&ctxt->urlTab->url + lVar35));
  lVar6 = lVar35 + 0x18;
  if (iVar7 != 0) goto code_r0x001ac3e4;
  goto LAB_001ac3bb;
code_r0x001ac3e4:
  if (*(int *)((long)&ctxt->urlTab->expanding + lVar35) != 0) {
    pxVar17 = pxVar33->elem;
    pcVar27 = "inclusion loop detected\n";
    iVar7 = 0x640;
    goto LAB_001ac4da;
  }
  cur = *(xmlDocPtr *)((long)&ctxt->urlTab->doc + lVar35);
  if (cur != (xmlDoc *)0x0) {
LAB_001ac263:
    if (pxVar13 == (xmlChar *)0x0) {
      pxVar17 = xmlDocGetRootElement(cur);
      if (pxVar17 == (xmlNodePtr)0x0) {
        pxVar17 = pxVar33->elem;
        pcVar27 = "document without root\n";
        iVar7 = 1;
        goto LAB_001ac4da;
      }
      pxVar24 = xmlDocCopyNode(pxVar17,ctxt->doc,1);
      pxVar33->inc = pxVar24;
      if (pxVar24 != (xmlNodePtr)0x0) {
        if (pxVar33->base != (xmlChar *)0x0) {
          xmlXIncludeBaseFixup(ctxt,pxVar17,pxVar24,pxVar33->base);
        }
        goto LAB_001ac9b3;
      }
LAB_001ac4a7:
      xmlXIncludeErrMemory(ctxt);
    }
    else {
      if ((ctxt->isStream == 0) || (cur != ctxt->doc)) {
        ctxt_00 = ctxt->xpctxt;
        if (ctxt_00 == (xmlXPathContextPtr)0x0) {
          ctxt_00 = xmlXPathNewContext(cur);
          ctxt->xpctxt = ctxt_00;
          if (ctxt_00 == (xmlXPathContextPtr)0x0) goto LAB_001ac4a7;
          if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
            xmlXPathSetErrorHandler(ctxt_00,ctxt->errorHandler,ctxt->errorCtxt);
            ctxt_00 = ctxt->xpctxt;
          }
        }
        else {
          ctxt_00->doc = cur;
        }
        obj = xmlXPtrEval(pxVar13,ctxt_00);
        iVar7 = (ctxt->xpctxt->lastError).code;
        if (iVar7 == 0) {
          if (obj == (xmlXPathObjectPtr)0x0) goto LAB_001ac9b3;
          xVar1 = obj->type;
          if ((XPATH_XSLT_TREE < xVar1) || ((0x31dU >> (xVar1 & 0x1f) & 1) == 0)) {
            pxVar3 = obj->nodesetval;
            pxVar30 = (xmlNodePtr)0x0;
            if (pxVar3 != (xmlNodeSetPtr)0x0) {
              uVar8 = pxVar3->nodeNr;
              pxVar17 = (xmlNodePtr)0x0;
              if (0 < (int)uVar8) {
                pxVar17 = (xmlNodePtr)(ulong)uVar8;
              }
              for (; pxVar17 != pxVar30; pxVar30 = (xmlNodePtr)((long)&pxVar30->_private + 1)) {
                if ((pxVar3->nodeTab[(long)pxVar30] != (xmlNodePtr)0x0) &&
                   (xVar2 = pxVar3->nodeTab[(long)pxVar30]->type,
                   xVar2 < (XML_XINCLUDE_END|XML_ELEMENT_NODE))) {
                  if ((0x1bdc00U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
                    if (xVar2 == XML_ATTRIBUTE_NODE) {
                      pxVar30 = pxVar33->elem;
                      pcVar27 = "XPointer selects an attribute: #%s\n";
                    }
                    else {
                      if (xVar2 != XML_NAMESPACE_DECL) goto LAB_001acc61;
                      pxVar30 = pxVar33->elem;
                      pcVar27 = "XPointer selects a namespace: #%s\n";
                    }
                  }
                  else {
                    pxVar30 = pxVar33->elem;
                    pcVar27 = "XPointer selects unexpected nodes: #%s\n";
                  }
                  xmlXIncludeErr(ctxt,pxVar30,0x64d,pcVar27,pxVar13);
                  goto LAB_001ad0de;
                }
LAB_001acc61:
              }
              if (xVar1 == XPATH_NODESET) {
                pxVar11 = pxVar33->base;
                pxVar17 = (xmlNodePtr)0x0;
                pxVar30 = (xmlNodePtr)0x0;
                for (lVar28 = 0; lVar28 < (int)uVar8; lVar28 = lVar28 + 1) {
                  pxVar25 = (xmlDoc *)pxVar3->nodeTab[lVar28];
                  pxVar24 = pxVar17;
                  pxVar36 = pxVar30;
                  if (pxVar25 != (xmlDoc *)0x0) {
                    xVar2 = pxVar25->type;
                    if (xVar2 < XML_DTD_NODE) {
                      if ((0x19aU >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
LAB_001acff6:
                        pxVar24 = xmlXIncludeCopyNode(ctxt,(xmlNodePtr)pxVar25,0,pxVar11);
                        if (pxVar24 != (xmlNodePtr)0x0) {
                          pxVar36 = pxVar24;
                          if (pxVar17 != (xmlNodePtr)0x0) {
                            do {
                              pxVar36 = pxVar17;
                              pxVar17 = pxVar36->next;
                            } while (pxVar36->next != (_xmlNode *)0x0);
                            pxVar24->prev = pxVar36;
                            pxVar36->next = pxVar24;
                            pxVar36 = pxVar30;
                          }
                          goto LAB_001ad084;
                        }
                        xmlFreeNodeList(pxVar30);
                        goto LAB_001ad0d7;
                      }
                      if ((0x2200U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
                      goto LAB_001ad069;
                      pxVar25 = (xmlDoc *)xmlDocGetRootElement(pxVar25);
                      if (pxVar25 != (xmlDoc *)0x0) goto LAB_001acff6;
                      pxVar25 = (xmlDoc *)pxVar3->nodeTab[lVar28];
                      iVar7 = 1;
                      pcVar27 = "document without root\n";
                    }
                    else {
LAB_001ad069:
                      iVar7 = 0x64d;
                      pcVar27 = "invalid node type in XPtr result\n";
                    }
                    xmlXIncludeErr(ctxt,(xmlNodePtr)pxVar25,iVar7,pcVar27,(xmlChar *)0x0);
                  }
LAB_001ad084:
                  uVar8 = pxVar3->nodeNr;
                  pxVar17 = pxVar24;
                  pxVar30 = pxVar36;
                }
              }
              else {
LAB_001ad0d7:
                pxVar30 = (xmlNodePtr)0x0;
              }
            }
            pxVar33->inc = pxVar30;
LAB_001ad0de:
            xmlXPathFreeObject(obj);
            goto LAB_001ac9b3;
          }
          xmlXIncludeErr(ctxt,pxVar33->elem,0x64d,"XPointer is not a range: #%s\n",pxVar13);
          xmlXPathFreeObject(obj);
          goto LAB_001ac8eb;
        }
        if (iVar7 == 2) goto LAB_001ac4a7;
        pxVar17 = pxVar33->elem;
        pcVar27 = "XPointer evaluation failed: #%s\n";
        iVar7 = 0x64c;
      }
      else {
        pxVar17 = pxVar33->elem;
        pcVar27 = "XPointer expressions not allowed in streaming mode\n";
        iVar7 = 0x64c;
LAB_001ac4da:
        pxVar13 = (xmlChar *)0x0;
      }
      xmlXIncludeErr(ctxt,pxVar17,iVar7,pcVar27,pxVar13);
    }
  }
  goto LAB_001ac8eb;
LAB_001ac5df:
  do {
    iVar7 = xmlParserInputBufferRead(in,0x1000);
  } while (0 < iVar7);
  if (iVar7 < 0) {
    iVar7 = in->error;
    if (iVar7 == 2) goto LAB_001acf4a;
    pcVar27 = "read error";
    pxVar24 = (xmlNodePtr)0x0;
    pxVar11 = (xmlChar *)0x0;
LAB_001acc9a:
    xmlXIncludeErr(ctxt,pxVar24,iVar7,pcVar27,pxVar11);
  }
  else {
    local_48 = (xmlXIncludeDoc *)xmlBufContent(in->buffer);
    sVar14 = xmlBufUse(in->buffer);
    iVar7 = 0;
    while( true ) {
      iVar9 = (int)sVar14;
      if (iVar9 - iVar7 == 0 || iVar9 < iVar7) break;
      base = (xmlChar *)CONCAT44(base._4_4_,iVar9 - iVar7);
      uVar8 = xmlGetUTF8Char((uchar *)((long)&local_48->doc + (long)iVar7),(int *)&base);
      if ((int)uVar8 < 0) {
LAB_001acc66:
        pxVar24 = pxVar33->elem;
        pcVar27 = "%s contains invalid char\n";
        iVar7 = 0x648;
        goto LAB_001acc9a;
      }
      if (uVar8 < 0x100) {
        if ((uVar8 < 0x20) && ((0xd < uVar8 || ((0x2600U >> (uVar8 & 0x1f) & 1) == 0))))
        goto LAB_001acc66;
      }
      else if (0xfffff < uVar8 - 0x10000 && (0x1ffd < uVar8 - 0xe000 && 0xd7ff < uVar8))
      goto LAB_001acc66;
      iVar7 = iVar7 + (int)base;
    }
    iVar7 = xmlNodeAddContentLen(pxVar17,(xmlChar *)local_48,iVar9);
    if (iVar7 < 0) {
      xmlXIncludeErrMemory(ctxt);
    }
    uVar8 = ctxt->txtMax;
    if ((int)uVar8 <= ctxt->txtNr) {
      if ((int)uVar8 < 1) {
        uVar29 = 8;
      }
      else {
        if (999999999 < uVar8) goto LAB_001acf4a;
        uVar34 = uVar8 + 1 >> 1;
        uVar29 = uVar34 + uVar8;
        if (1000000000 - uVar34 < uVar8) {
          uVar29 = 1000000000;
        }
      }
      pxVar23 = (xmlXIncludeTxt *)(*xmlRealloc)(ctxt->txtTab,(ulong)uVar29 << 4);
      if (pxVar23 == (xmlXIncludeTxt *)0x0) goto LAB_001acf4a;
      ctxt->txtMax = uVar29;
      ctxt->txtTab = pxVar23;
    }
    pxVar19 = xmlStrdup(pxVar17->content);
    ctxt->txtTab[ctxt->txtNr].text = pxVar19;
    if (pxVar19 != (xmlChar *)0x0 || pxVar17->content == (xmlChar *)0x0) {
      pxVar11 = xmlStrdup(pxVar11);
      iVar7 = ctxt->txtNr;
      ctxt->txtTab[iVar7].url = pxVar11;
      if (pxVar11 == (xmlChar *)0x0) {
        xmlXIncludeErrMemory(ctxt);
        (*xmlFree)(ctxt->txtTab[ctxt->txtNr].text);
        goto LAB_001ac8c2;
      }
      ctxt->txtNr = iVar7 + 1;
LAB_001ac7c1:
      pxVar33->inc = pxVar17;
      xmlFreeNode((xmlNodePtr)0x0);
      xmlFreeInputStream(pxVar16);
      xmlFreeParserCtxt(pxVar15);
      xmlCharEncCloseFunc((xmlCharEncodingHandler *)uri);
      (*xmlFree)(pxVar13);
      goto LAB_001ac9b3;
    }
LAB_001acf4a:
    xmlXIncludeErrMemory(ctxt);
  }
  goto LAB_001ac8c2;
}

Assistant:

static xmlXIncludeRefPtr
xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node) {
    xmlXIncludeRefPtr ref;
    int i;

    if (ctxt->fatalErr)
        return(NULL);
    if (ctxt->depth >= XINCLUDE_MAX_DEPTH) {
        xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                       "maximum recursion depth exceeded\n", NULL);
        ctxt->fatalErr = 1;
        return(NULL);
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /*
     * The XInclude engine offers no protection against exponential
     * expansion attacks similar to "billion laughs". Avoid timeouts by
     * limiting the total number of replacements when fuzzing.
     *
     * Unfortuately, a single XInclude can already result in quadratic
     * behavior:
     *
     *     <doc xmlns:xi="http://www.w3.org/2001/XInclude">
     *       <xi:include xpointer="xpointer(//e)"/>
     *       <e>
     *         <e>
     *           <e>
     *             <!-- more nested elements -->
     *           </e>
     *         </e>
     *       </e>
     *     </doc>
     */
    if (ctxt->incTotal >= 20)
        return(NULL);
    ctxt->incTotal++;
#endif

    for (i = 0; i < ctxt->incNr; i++) {
        if (ctxt->incTab[i]->elem == node) {
            if (ctxt->incTab[i]->expanding) {
                xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                               "inclusion loop detected\n", NULL);
                return(NULL);
            }
            return(ctxt->incTab[i]);
        }
    }

    ref = xmlXIncludeAddNode(ctxt, node);
    if (ref == NULL)
        return(NULL);
    ref->expanding = 1;
    ctxt->depth++;
    xmlXIncludeLoadNode(ctxt, ref);
    ctxt->depth--;
    ref->expanding = 0;

    return(ref);
}